

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseUnary(StructuralParser *this)

{
  bool bVar1;
  TokenType token;
  Expression *args_1;
  Op local_5c;
  undefined1 local_58 [4];
  Op type;
  Context context;
  StructuralParser *this_local;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4ad381);
  if (bVar1) {
    this_local = (StructuralParser *)parsePreIncDec(this,true);
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"--");
    if (bVar1) {
      this_local = (StructuralParser *)parsePreIncDec(this,false);
    }
    else {
      context.parentScope = (Scope *)anon_var_dwarf_d480a;
      bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x4cfab9,(TokenType)0x4ae81c,(TokenType)"~");
      if (bVar1) {
        getContext((Context *)local_58,this);
        token = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::skip(&this->super_SOULTokeniser);
        local_5c = getUnaryOpForToken(token);
        args_1 = parseUnary(this);
        this_local = (StructuralParser *)
                     allocate<soul::AST::UnaryOperator,soul::AST::Context&,soul::AST::Expression&,soul::UnaryOp::Op&>
                               (this,(Context *)local_58,args_1,&local_5c);
        AST::Context::~Context((Context *)local_58);
      }
      else {
        this_local = (StructuralParser *)parseFactor(this);
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseUnary()
    {
        if (matchIf (Operator::plusplus))    return parsePreIncDec (true);
        if (matchIf (Operator::minusminus))  return parsePreIncDec (false);

        if (matchesAny (Operator::minus, Operator::logicalNot, Operator::bitwiseNot))
        {
            auto context = getContext();
            auto type = getUnaryOpForToken (skip());
            return allocate<AST::UnaryOperator> (context, parseUnary(), type);
        }

        return parseFactor();
    }